

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::Descriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,Descriptor *this,DebugStringOptions *options)

{
  DebugStringOptions *options_local;
  Descriptor *this_local;
  string *contents;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  DebugString(this,0,__return_storage_ptr__,options,true);
  return __return_storage_ptr__;
}

Assistant:

std::string Descriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options, /* include_opening_clause */ true);
  return contents;
}